

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O3

void __thiscall
validation_layer::validationCheckerTemplate::~validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  if (this->enableValidationCheckerTemplate == true) {
    if (templateChecker != (long *)0x0) {
      (**(code **)(*templateChecker + 0xcb8))();
    }
    if (DAT_001e85f8 != (long *)0x0) {
      (**(code **)(*DAT_001e85f8 + 0x458))();
    }
    if (DAT_001e85f0 != (long *)0x0) {
      (**(code **)(*DAT_001e85f0 + 0x958))();
      return;
    }
  }
  return;
}

Assistant:

validationCheckerTemplate::~validationCheckerTemplate() {
        if(enableValidationCheckerTemplate) {
            delete templateChecker.zeValidation;
            delete templateChecker.zetValidation;
            delete templateChecker.zesValidation;
        }
    }